

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

FState * __thiscall PClassActor::FindState(PClassActor *this,int numnames,FName *names,bool exact)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FState *pFVar4;
  int iVar5;
  bool bVar6;
  FState *pFVar7;
  FStateLabels *pFVar8;
  FStateLabel *in_R10;
  uint uVar9;
  int iVar10;
  
  pFVar8 = this->StateList;
  if (pFVar8 == (FStateLabels *)0x0) {
    return (FState *)0x0;
  }
  iVar3 = 0;
  bVar6 = 0 < numnames;
  if (0 < numnames) {
    pFVar7 = (FState *)0x0;
    do {
      iVar1 = names->Index;
      iVar5 = pFVar8->NumLabels + -1;
      iVar10 = 0;
      do {
        if (iVar5 < iVar10) {
          in_R10 = (FStateLabel *)0x0;
          break;
        }
        uVar9 = (uint)(iVar5 + iVar10) >> 1;
        iVar2 = pFVar8->Labels[uVar9].Label.Index;
        if (iVar2 == iVar1) {
          in_R10 = pFVar8->Labels + uVar9;
        }
        else if (iVar2 < iVar1) {
          iVar10 = uVar9 + 1;
        }
        else {
          iVar5 = uVar9 - 1;
        }
      } while (iVar2 != iVar1);
      if (in_R10 == (FStateLabel *)0x0) goto LAB_00456387;
      iVar3 = iVar3 + 1;
      pFVar7 = in_R10->State;
      pFVar8 = in_R10->Children;
      bVar6 = iVar3 < numnames;
      if ((pFVar8 == (FStateLabels *)0x0) || (names = names + 1, numnames <= iVar3))
      goto LAB_00456387;
    } while( true );
  }
  pFVar7 = (FState *)0x0;
LAB_00456387:
  pFVar4 = (FState *)0x0;
  if (!exact) {
    pFVar4 = pFVar7;
  }
  if (!bVar6) {
    pFVar4 = pFVar7;
  }
  return pFVar4;
}

Assistant:

FState *PClassActor::FindState(int numnames, FName *names, bool exact) const
{
	FStateLabels *labels = StateList;
	FState *best = NULL;

	if (labels != NULL)
	{
		int count = 0;
		FStateLabel *slabel = NULL;
		FName label;

		// Find the best-matching label for this class.
		while (labels != NULL && count < numnames)
		{
			label = *names++;
			slabel = labels->FindLabel(label);

			if (slabel != NULL)
			{
				count++;
				labels = slabel->Children;
				best = slabel->State;
			}
			else
			{
				break;
			}
		}
		if (count < numnames && exact)
		{
			return NULL;
		}
	}
	return best;
}